

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5ParseSetColset(Fts5Parse *pParse,Fts5ExprNode *pNode,Fts5Colset *pColset,
                       Fts5Colset **ppFree)

{
  size_t __n;
  int iVar1;
  int iVar2;
  Fts5ExprNearset *pFVar3;
  Fts5Colset *pFVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int i;
  long lVar9;
  
  if (pParse->rc != 0) {
    return;
  }
  if ((pNode->eType != 4) && (pNode->eType != 9)) {
    for (lVar9 = 0; lVar9 < pNode->nChild; lVar9 = lVar9 + 1) {
      fts5ParseSetColset(pParse,pNode->apChild[lVar9],pColset,ppFree);
    }
    return;
  }
  pFVar3 = pNode->pNear;
  pFVar4 = pFVar3->pColset;
  if (pFVar4 != (Fts5Colset *)0x0) {
    iVar6 = 0;
    uVar5 = 0;
    uVar7 = 0;
LAB_001bb31c:
    do {
      uVar7 = (ulong)(int)uVar7;
      while( true ) {
        if ((pFVar4->nCol <= (int)uVar7) || (pColset->nCol <= iVar6)) {
          pFVar4->nCol = uVar5;
          if (uVar5 != 0) {
            return;
          }
          pNode->eType = 0;
          pNode->xNext = (_func_int_Fts5Expr_ptr_Fts5ExprNode_ptr_int_i64 *)0x0;
          return;
        }
        iVar2 = pFVar4->aiCol[uVar7];
        iVar1 = pColset->aiCol[iVar6];
        if (iVar2 == iVar1) {
          uVar8 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
          pFVar4->aiCol[uVar8] = iVar2;
          iVar6 = iVar6 + 1;
          uVar7 = (ulong)((int)uVar7 + 1);
          goto LAB_001bb31c;
        }
        if (iVar2 != iVar1 && iVar1 <= iVar2) break;
        uVar7 = uVar7 + 1;
      }
      iVar6 = iVar6 + 1;
    } while( true );
  }
  if (*ppFree != (Fts5Colset *)0x0) {
    pFVar3->pColset = pColset;
    *ppFree = (Fts5Colset *)0x0;
    return;
  }
  if (pColset != (Fts5Colset *)0x0) {
    __n = (long)pColset->nCol * 4 + 4;
    pFVar4 = (Fts5Colset *)sqlite3Fts5MallocZero(&pParse->rc,__n);
    if (pFVar4 != (Fts5Colset *)0x0) {
      memcpy(pFVar4,pColset,__n);
      goto LAB_001bb3d3;
    }
  }
  pFVar4 = (Fts5Colset *)0x0;
LAB_001bb3d3:
  pFVar3->pColset = pFVar4;
  return;
}

Assistant:

static void fts5ParseSetColset(
  Fts5Parse *pParse, 
  Fts5ExprNode *pNode, 
  Fts5Colset *pColset,
  Fts5Colset **ppFree
){
  if( pParse->rc==SQLITE_OK ){
    assert( pNode->eType==FTS5_TERM || pNode->eType==FTS5_STRING 
         || pNode->eType==FTS5_AND  || pNode->eType==FTS5_OR
         || pNode->eType==FTS5_NOT  || pNode->eType==FTS5_EOF
    );
    if( pNode->eType==FTS5_STRING || pNode->eType==FTS5_TERM ){
      Fts5ExprNearset *pNear = pNode->pNear;
      if( pNear->pColset ){
        fts5MergeColset(pNear->pColset, pColset);
        if( pNear->pColset->nCol==0 ){
          pNode->eType = FTS5_EOF;
          pNode->xNext = 0;
        }
      }else if( *ppFree ){
        pNear->pColset = pColset;
        *ppFree = 0;
      }else{
        pNear->pColset = fts5CloneColset(&pParse->rc, pColset);
      }
    }else{
      int i;
      assert( pNode->eType!=FTS5_EOF || pNode->nChild==0 );
      for(i=0; i<pNode->nChild; i++){
        fts5ParseSetColset(pParse, pNode->apChild[i], pColset, ppFree);
      }
    }
  }
}